

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<GraphContigger> * __thiscall
pybind11::class_<GraphContigger>::
def<bool(GraphContigger::*)(GraphEditor&,NodeView&,NodeView&,PairedReadsDatastore&,int,int,int,bool),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
          (class_<GraphContigger> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,
          arg *extra_1,arg *extra_2,arg *extra_3,arg_v *extra_4,arg_v *extra_5,arg_v *extra_6,
          arg_v *extra_7)

{
  arg *in_RCX;
  arg *in_RDX;
  sibling *extra_2_00;
  arg_v *unaff_RBX;
  arg_v *in_RSI;
  arg_v *in_RDI;
  arg *in_R8;
  arg *in_R9;
  arg_v *unaff_R14;
  cpp_function cf;
  handle *in_stack_fffffffffffffee8;
  sibling *in_stack_fffffffffffffef0;
  none *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  handle in_stack_ffffffffffffff10;
  handle in_stack_ffffffffffffff18;
  is_method *in_stack_ffffffffffffff60;
  name *in_stack_ffffffffffffff68;
  offset_in_Node_to_subr in_stack_ffffffffffffff70;
  PyObject *this_00;
  is_method local_68;
  name in_stack_ffffffffffffffa0;
  char *name__00;
  object *cls;
  arg_v *extra_8;
  
  name__00 = in_RDX->name;
  cls = *(object **)&in_RDX->field_0x8;
  extra_8 = in_RDI;
  _GraphContigger___pybind11__method_adaptor<GraphContigger,bool,GraphContigger,GraphEditor&,NodeView&,NodeView&,PairedReadsDatastore&,int,int,int,bool>_bool_GraphContigger_____GraphEditor__NodeView__NodeView__PairedReadsDatastore__int_int_int_bool___
            (name__00,(offset_in_Node_to_subr)cls);
  pybind11::name::name((name *)&stack0xffffffffffffffa0,(char *)in_RSI);
  is_method::is_method(&local_68,(handle *)in_RDI);
  this_00 = (PyObject *)(in_RDI->super_arg).name;
  none::none(in_stack_ffffffffffffff00);
  getattr(in_stack_ffffffffffffff18,in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  sibling::sibling(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  cpp_function::
  cpp_function<bool,GraphContigger,GraphEditor&,NodeView&,NodeView&,PairedReadsDatastore&,int,int,int,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
            ((cpp_function *)this_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,extra_2_00,in_R9,in_R8,in_RCX,in_RDX,in_RSI,extra_8,unaff_RBX
             ,unaff_R14);
  object::~object((object *)0x286f62);
  none::~none((none *)0x286f6f);
  pybind11::detail::add_class_method(cls,name__00,(cpp_function *)in_stack_ffffffffffffffa0.value);
  cpp_function::~cpp_function((cpp_function *)0x286f98);
  return (class_<GraphContigger> *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }